

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError oct2nummax(long *val,char *str,long max)

{
  ParameterError PVar1;
  
  PVar1 = getnum(val,str,8);
  if (PVar1 == PARAM_OK) {
    PVar1 = PARAM_NUMBER_TOO_LARGE;
    if (*val <= max) {
      PVar1 = (ParameterError)(*val >> 0x3f) & PARAM_NEGATIVE_NUMERIC;
    }
  }
  return PVar1;
}

Assistant:

ParameterError oct2nummax(long *val, const char *str, long max)
{
  ParameterError result = getnum(val, str, 8);
  if(result != PARAM_OK)
    return result;
  else if(*val > max)
    return PARAM_NUMBER_TOO_LARGE;
  else if(*val < 0)
    return PARAM_NEGATIVE_NUMERIC;

  return PARAM_OK;
}